

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall DSBarInfo::~DSBarInfo(DSBarInfo *this)

{
  DSBarInfo *this_local;
  
  (this->super_DBaseStatusBar).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00a06668;
  FImageCollection::Uninit(&this->Images);
  FImageCollection::~FImageCollection(&this->Images);
  DBaseStatusBar::~DBaseStatusBar(&this->super_DBaseStatusBar);
  return;
}

Assistant:

~DSBarInfo ()
	{
		Images.Uninit();
	}